

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

ptr __thiscall
gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
shift_into_uninitialized
          (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *this,
          ptr pos,size_ty n_shift)

{
  size_ty *psVar1;
  ptr ppVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  ptr ppVar6;
  long lVar7;
  ulong uVar8;
  
  ppVar6 = (this->m_data).
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr +
           (this->m_data).
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_size;
  if (n_shift != 0) {
    uVar8 = 0;
    do {
      puVar3 = (undefined8 *)((long)&ppVar6[-n_shift].first.first + uVar8);
      uVar5 = puVar3[1];
      puVar4 = (undefined8 *)((long)&(ppVar6->first).first + uVar8);
      *puVar4 = *puVar3;
      puVar4[1] = uVar5;
      uVar8 = uVar8 + 0x10;
    } while (uVar8 != n_shift * 0x10);
  }
  psVar1 = &(this->m_data).
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_size;
  *psVar1 = *psVar1 + n_shift;
  lVar7 = (long)((long)ppVar6 + (n_shift * -0x10 - (long)pos)) >> 4;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    uVar8 = n_shift * 0x10 ^ 0xfffffffffffffff8;
    do {
      ppVar2 = ppVar6 + -1;
      ppVar6[-1].first.first = *(int *)((long)ppVar6 + (uVar8 - 8));
      ppVar6[-1].first.second = *(int *)((long)ppVar6 + (uVar8 - 4));
      ppVar6[-1].second = *(double *)((long)&(ppVar6->first).first + uVar8);
      lVar7 = lVar7 + -1;
      ppVar6 = ppVar2;
    } while (1 < lVar7);
    return ppVar2;
  }
  return ppVar6;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }